

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O0

void __thiscall QMarkdownTextEdit::paintEvent(QMarkdownTextEdit *this,QPaintEvent *e)

{
  qreal qVar1;
  qreal qVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  QWidget *this_00;
  qreal *pqVar8;
  QTextOption *pQVar9;
  QRect QVar10;
  QColor QVar11;
  undefined1 auVar12 [16];
  bool local_351;
  bool local_2ff;
  byte local_2f3;
  byte local_2ea;
  QPaintDevice *local_2a0;
  QTextBlock local_298;
  QColor local_288;
  undefined6 local_278;
  undefined2 local_272;
  undefined6 uStack_270;
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  QRectF lineRect;
  QTextLine line;
  QTextBlock local_228;
  QTextCursor local_218 [8];
  QTextCursor cursor;
  QFlags<Qt::AlignmentFlag> local_20c;
  QTextOption local_208 [8];
  QTextOption opt;
  QTextLayout *layout;
  QPainterPath local_1d0 [8];
  QRectF local_1c8;
  double local_1a8;
  qreal adjustedHeight;
  QPainterPath path;
  QTextBlock local_190 [2];
  int local_16c;
  undefined1 auStack_168 [4];
  int prevBlockState;
  byte local_151;
  QString local_150;
  QLatin1String local_138;
  QString local_128;
  int local_10c;
  undefined1 local_108 [4];
  int state;
  undefined1 local_e8 [8];
  QRectF r;
  int cornerRadius;
  undefined4 local_b8;
  undefined2 uStack_b4;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined2 local_a4;
  QColor *local_a0;
  QColor *color;
  double dStack_90;
  bool done;
  qreal dy;
  undefined1 auStack_80 [5];
  bool drawBlock;
  bool clipTop;
  bool inBlockArea;
  QRectF blockAreaRect;
  QPointF offset;
  bool firstVisible;
  undefined1 local_40 [8];
  QRect viewportRect;
  QPainter painter;
  QTextBlock block;
  QPaintEvent *e_local;
  QMarkdownTextEdit *this_local;
  
  QPlainTextEdit::firstVisibleBlock();
  lVar7 = QAbstractScrollArea::viewport();
  local_2a0 = (QPaintDevice *)0x0;
  if (lVar7 != 0) {
    local_2a0 = (QPaintDevice *)(lVar7 + 0x10);
  }
  QPainter::QPainter((QPainter *)&viewportRect.x2,local_2a0);
  this_00 = (QWidget *)QAbstractScrollArea::viewport();
  QVar10 = QWidget::rect(this_00);
  viewportRect._0_8_ = QVar10._8_8_;
  local_40 = QVar10._0_8_;
  bVar5 = true;
  blockAreaRect.h = (qreal)QPlainTextEdit::contentOffset();
  QRectF::QRectF((QRectF *)auStack_80);
  dy._7_1_ = 0;
  dy._6_1_ = 0;
  dy._5_1_ = 0;
  dStack_90 = 0.0;
  color._7_1_ = 0;
  QVar11 = MarkdownHighlighter::codeBlockBackgroundColor();
  local_b0 = QVar11._0_8_;
  local_b8 = QVar11.ct._4_4_;
  local_a8 = local_b8;
  uStack_b4 = QVar11.ct._8_2_;
  local_a4 = uStack_b4;
  local_a0 = (QColor *)&local_b0;
  r.h._4_4_ = 5;
  do {
    bVar3 = QTextBlock::isValid();
    local_2ea = 0;
    if ((bVar3 & 1) != 0) {
      local_2ea = color._7_1_ ^ 0xff;
    }
    if ((local_2ea & 1) == 0) {
      QPainter::end();
      QPlainTextEdit::paintEvent((QPaintEvent *)this);
      QPainter::~QPainter((QPainter *)&viewportRect.x2);
      return;
    }
    QPlainTextEdit::blockBoundingRect((QTextBlock *)local_108);
    QRectF::translated((QRectF *)local_e8,(QRectF *)local_108,(QPointF *)&blockAreaRect.h);
    local_10c = QTextBlock::userState();
    if ((dy._7_1_ & 1) == 0) {
      bVar4 = MarkdownHighlighter::isCodeBlock(local_10c);
      if (!bVar4) goto LAB_0011aa7b;
      local_151 = 0;
      QTextBlock::text();
      QLatin1String::QLatin1String(&local_138,"```");
      bVar3 = QString::startsWith((QLatin1String *)&local_128,(CaseSensitivity)local_138.m_size);
      local_2f3 = 0;
      if ((bVar3 & 1) == 0) {
        QTextBlock::text();
        local_151 = 1;
        QLatin1String::QLatin1String((QLatin1String *)auStack_168,"~~~");
        local_2f3 = QString::startsWith((QLatin1String *)&local_150,(CaseSensitivity)_auStack_168);
        local_2f3 = local_2f3 ^ 0xff;
      }
      if ((local_151 & 1) != 0) {
        QString::~QString(&local_150);
      }
      QString::~QString(&local_128);
      if ((local_2f3 & 1) != 0) {
        _auStack_80 = (qreal)local_e8;
        blockAreaRect.xp = r.xp;
        blockAreaRect.yp = r.yp;
        blockAreaRect.w = r.w;
        dStack_90 = 0.0;
        dy._7_1_ = 1;
      }
      QTextBlock::previous();
      local_16c = QTextBlock::userState();
      if (bVar5) {
        bVar5 = MarkdownHighlighter::isCodeBlock(local_16c);
        if (bVar5) {
          dy._6_1_ = 1;
        }
      }
    }
    else {
LAB_0011aa7b:
      if ((dy._7_1_ & 1) != 0) {
        bVar5 = MarkdownHighlighter::isCodeBlockEnd(local_10c);
        if (bVar5) {
          dy._5_1_ = 1;
          dy._7_1_ = 0;
          QRectF::setHeight((QRectF *)auStack_80,dStack_90);
        }
      }
    }
    local_2ff = false;
    if ((dy._7_1_ & 1) != 0) {
      QPlainTextEdit::document();
      QTextDocument::lastBlock();
      local_2ff = QTextBlock::operator==((QTextBlock *)&painter,local_190);
    }
    if (local_2ff != false) {
      dy._5_1_ = 1;
      dy._7_1_ = 0;
      qVar1 = QRectF::height((QRectF *)local_e8);
      dStack_90 = qVar1 + dStack_90;
      QRectF::setHeight((QRectF *)auStack_80,dStack_90);
    }
    qVar1 = QRectF::height((QRectF *)local_e8);
    pqVar8 = QPointF::ry((QPointF *)&blockAreaRect.h);
    *pqVar8 = qVar1 + *pqVar8;
    qVar1 = QRectF::height((QRectF *)local_e8);
    dStack_90 = qVar1 + dStack_90;
    qVar1 = QPointF::y((QPointF *)&blockAreaRect.h);
    iVar6 = QRect::height((QRect *)local_40);
    if ((double)iVar6 < qVar1) {
      if ((dy._7_1_ & 1) != 0) {
        QRectF::setHeight((QRectF *)auStack_80,dStack_90);
        dy._5_1_ = 1;
      }
      color._7_1_ = 1;
    }
    qVar1 = QPointF::y((QPointF *)&blockAreaRect.h);
    iVar6 = QRect::height((QRect *)local_40);
    if ((double)iVar6 < qVar1) {
      if ((dy._7_1_ & 1) != 0) {
        QRectF::setHeight((QRectF *)auStack_80,dStack_90);
        dy._5_1_ = 1;
      }
      color._7_1_ = 1;
    }
    if ((dy._5_1_ & 1) != 0) {
      QPainter::setCompositionMode((int)&viewportRect + CompositionMode_DestinationOut);
      QPainter::setPen((int)&viewportRect + 8);
      QBrush::QBrush((QBrush *)&path,local_a0,SolidPattern);
      QPainter::setBrush((QBrush *)&viewportRect.x2);
      QBrush::~QBrush((QBrush *)&path);
      if ((dy._6_1_ & 1) == 0) {
        QPainter::drawRoundedRect(0,&viewportRect.x2,auStack_80,0);
      }
      else {
        QPainterPath::QPainterPath((QPainterPath *)&adjustedHeight);
        QPainterPath::setFillRule((FillRule)(QPainterPath *)&adjustedHeight);
        QPainterPath::addRoundedRect(0,&adjustedHeight,auStack_80,0);
        qVar1 = QRectF::height((QRectF *)auStack_80);
        local_1a8 = qVar1 * 0.5;
        QRectF::adjusted(&local_1c8,(QRectF *)auStack_80,0.0,0.0,0.0,-local_1a8);
        QPainterPath::addRect((QRectF *)&adjustedHeight);
        QPainterPath::simplified();
        QPainter::drawPath((QPainterPath *)&viewportRect.x2);
        QPainterPath::~QPainterPath(local_1d0);
        dy._6_1_ = 0;
        QPainterPath::~QPainterPath((QPainterPath *)&adjustedHeight);
      }
      dy._5_1_ = 0;
    }
    QTextBlock::text();
    bVar3 = QString::isRightToLeft();
    QString::~QString((QString *)&layout);
    if ((bVar3 & 1) != 0) {
      pQVar9 = (QTextOption *)QTextBlock::layout();
      QFlags<Qt::AlignmentFlag>::QFlags(&local_20c,AlignRight);
      QTextOption::QTextOption(local_208,(QFlags_conflict1 *)(ulong)local_20c.i);
      QTextOption::setTextDirection(local_208,RightToLeft);
      QTextLayout::setTextOption(pQVar9);
      QTextOption::~QTextOption(local_208);
    }
    QPlainTextEdit::textCursor();
    bVar5 = highlightCurrentLine(this);
    local_351 = false;
    if (bVar5) {
      QTextCursor::block();
      local_351 = QTextBlock::operator==(&local_228,(QTextBlock *)&painter);
    }
    if (local_351 != false) {
      iVar6 = QTextBlock::layout();
      QTextCursor::positionInBlock();
      lineRect.h._0_4_ = QTextLayout::lineForTextPosition(iVar6);
      QTextLine::rect();
      qVar1 = QRectF::top((QRectF *)local_258);
      qVar2 = QRectF::top((QRectF *)local_e8);
      QRectF::moveTop((QRectF *)local_258,qVar1 + qVar2);
      QRectF::setLeft((QRectF *)local_258,0.0);
      iVar6 = QRect::width((QRect *)local_40);
      QRectF::setRight((QRectF *)local_258,(double)iVar6);
      auVar12 = QRectF::toAlignedRect();
      local_268 = auVar12;
      local_288 = currentLineHighlightColor(this);
      uStack_270 = local_288.ct._4_6_;
      local_278 = local_288._0_6_;
      local_272 = local_288.ct._2_2_;
      QPainter::fillRect((QRect *)&viewportRect.x2,(QColor *)local_268);
    }
    QTextBlock::next();
    QTextBlock::operator=((QTextBlock *)&painter,&local_298);
    bVar5 = false;
    QTextCursor::~QTextCursor(local_218);
  } while( true );
}

Assistant:

void QMarkdownTextEdit::paintEvent(QPaintEvent *e) {
    QTextBlock block = firstVisibleBlock();

    QPainter painter(viewport());
    const QRect viewportRect = viewport()->rect();
    // painter.fillRect(viewportRect, Qt::transparent);
    bool firstVisible = true;
    QPointF offset(contentOffset());
    QRectF blockAreaRect;    // Code or block quote rect.
    bool inBlockArea = false;

    bool clipTop = false;
    bool drawBlock = false;
    qreal dy = 0.0;
    bool done = false;

    const QColor &color = MarkdownHighlighter::codeBlockBackgroundColor();
    const int cornerRadius = 5;

    while (block.isValid() && !done) {
        const QRectF r = blockBoundingRect(block).translated(offset);
        const int state = block.userState();

        if (!inBlockArea && MarkdownHighlighter::isCodeBlock(state)) {
            // skip the backticks
            if (!block.text().startsWith(QLatin1String("```")) &&
                !block.text().startsWith(QLatin1String("~~~"))) {
                blockAreaRect = r;
                dy = 0.0;
                inBlockArea = true;
            }

            // If this is the first visible block within the viewport
            // and if the previous block is part of the text block area,
            // then the rectangle to draw for the block area will have
            // its top clipped by the viewport and will need to be
            // drawn specially.
            const int prevBlockState = block.previous().userState();
            if (firstVisible &&
                MarkdownHighlighter::isCodeBlock(prevBlockState)) {
                clipTop = true;
            }
        }
        // Else if the block ends a text block area...
        else if (inBlockArea && MarkdownHighlighter::isCodeBlockEnd(state)) {
            drawBlock = true;
            inBlockArea = false;
            blockAreaRect.setHeight(dy);
        }
        // If the block is at the end of the document and ends a text
        // block area...
        //
        if (inBlockArea && block == this->document()->lastBlock()) {
            drawBlock = true;
            inBlockArea = false;
            dy += r.height();
            blockAreaRect.setHeight(dy);
        }
        offset.ry() += r.height();
        dy += r.height();

        // If this is the last text block visible within the viewport...
        if (offset.y() > viewportRect.height()) {
            if (inBlockArea) {
                blockAreaRect.setHeight(dy);
                drawBlock = true;
            }

            // Finished drawing.
            done = true;
        }
        // If this is the last text block visible within the viewport...
        if (offset.y() > viewportRect.height()) {
            if (inBlockArea) {
                blockAreaRect.setHeight(dy);
                drawBlock = true;
            }
            // Finished drawing.
            done = true;
        }

        if (drawBlock) {
            painter.setCompositionMode(QPainter::CompositionMode_SourceOver);
            painter.setPen(Qt::NoPen);
            painter.setBrush(QBrush(color));

            // If the first visible block is "clipped" such that the previous
            // block is part of the text block area, then only draw a rectangle
            // with the bottom corners rounded, and with the top corners square
            // to reflect that the first visible block is part of a larger block
            // of text.
            //
            if (clipTop) {
                QPainterPath path;
                path.setFillRule(Qt::WindingFill);
                path.addRoundedRect(blockAreaRect, cornerRadius, cornerRadius);
                qreal adjustedHeight = blockAreaRect.height() / 2;
                path.addRect(blockAreaRect.adjusted(0, 0, 0, -adjustedHeight));
                painter.drawPath(path.simplified());
                clipTop = false;
            }
            // Else draw the entire rectangle with all corners rounded.
            else {
                painter.drawRoundedRect(blockAreaRect, cornerRadius,
                                        cornerRadius);
            }

            drawBlock = false;
        }

        // this fixes the RTL bug of QPlainTextEdit
        // https://bugreports.qt.io/browse/QTBUG-7516
        if (block.text().isRightToLeft()) {
            QTextLayout *layout = block.layout();
            // opt = document()->defaultTextOption();
            QTextOption opt = QTextOption(Qt::AlignRight);
            opt.setTextDirection(Qt::RightToLeft);
            layout->setTextOption(opt);
        }

        // Current line highlight
        QTextCursor cursor = textCursor();
        if (highlightCurrentLine() && cursor.block() == block) {
            QTextLine line = block.layout()->lineForTextPosition(cursor.positionInBlock());
            QRectF lineRect = line.rect();
            lineRect.moveTop(lineRect.top() + r.top());
            lineRect.setLeft(0.);
            lineRect.setRight(viewportRect.width());
            painter.fillRect(lineRect.toAlignedRect(), currentLineHighlightColor());
        }

        block = block.next();
        firstVisible = false;
    }

    painter.end();
    QPlainTextEdit::paintEvent(e);
}